

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_1::CreateThread<vkt::api::(anonymous_namespace)::DescriptorSet>::runThread
          (CreateThread<vkt::api::(anonymous_namespace)::DescriptorSet> *this)

{
  int iVar1;
  ulong uVar2;
  VkDescriptorSetAllocateInfo local_80;
  Move<vk::Handle<(vk::HandleType)22>_> local_58;
  
  iVar1 = 0;
  uVar2 = 0;
  do {
    if ((int)(uVar2 / 0x14) * 0x14 + iVar1 == 0) {
      de::SpinBarrier::sync((this->super_ThreadGroupThread).m_barrier);
    }
    local_80.sType = 0x22;
    local_80.pNext = (void *)0x0;
    local_80.descriptorPool.m_internal =
         (this->m_resources->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.
         m_data.object.m_internal;
    local_80.descriptorSetCount = 1;
    local_80.pSetLayouts = (VkDescriptorSetLayout *)&(this->m_resources->descriptorSetLayout).object
    ;
    ::vk::allocateDescriptorSet(&local_58,this->m_env->vkd,this->m_env->device,&local_80);
    if (local_58.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal != 0) {
      local_80._0_8_ =
           local_58.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
      (*(local_58.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x3d])
                (local_58.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                 m_deviceIface,
                 local_58.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
                 local_58.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
                 m_internal,1,&local_80);
    }
    uVar2 = (ulong)((int)uVar2 + 1);
    iVar1 = iVar1 + -1;
  } while (iVar1 != -100);
  return;
}

Assistant:

void runThread (void)
	{
		const int	numIters			= getCreateCount<Object>();
		const int	itersBetweenSyncs	= numIters / 5;

		DE_ASSERT(itersBetweenSyncs > 0);

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			// Sync every Nth iteration to make entering driver at the same time more likely
			if ((iterNdx % itersBetweenSyncs) == 0)
				barrier();

			{
				Unique<typename Object::Type>	obj	(Object::create(m_env, m_resources, m_params));
			}
		}
	}